

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIntegers.h
# Opt level: O2

int64_t HighsIntegers::denominator(double x,double eps,int64_t maxdenom)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  HighsCDouble HVar8;
  HighsCDouble local_68;
  HighsCDouble local_58;
  double local_48;
  
  local_58.lo = 0.0;
  local_58.hi = x;
  local_48 = x;
  HVar8 = HighsCDouble::operator-(&local_58,(double)(long)x);
  local_68.hi = HVar8.hi;
  lVar2 = 0;
  lVar3 = 1;
  lVar1 = (long)x;
  lVar6 = 1;
  while (lVar5 = lVar1, local_68.lo = HVar8.lo, eps < HVar8.hi + local_68.lo) {
    local_58 = operator/(1.0,&local_68);
    dVar7 = local_58.hi + local_58.lo;
    if (9007199254740992.0 < dVar7) break;
    lVar1 = (long)dVar7;
    lVar4 = lVar3 * lVar1 + lVar2;
    if (maxdenom < lVar4) break;
    HVar8 = HighsCDouble::operator-(&local_58,(double)lVar1);
    local_68.hi = HVar8.hi;
    lVar2 = lVar3;
    lVar3 = lVar4;
    lVar1 = lVar5 * lVar1 + lVar6;
    lVar6 = lVar5;
  }
  lVar1 = (maxdenom - lVar2) / lVar3;
  lVar2 = lVar1 * lVar3 + lVar2;
  if (ABS(ABS(local_48) - (double)lVar5 / (double)lVar3) <
      ABS(ABS(local_48) - (double)(lVar1 * lVar5 + lVar6) / (double)lVar2)) {
    lVar2 = lVar3;
  }
  return lVar2;
}

Assistant:

static int64_t denominator(double x, double eps, int64_t maxdenom) {
    int64_t ai = (int64_t)x;
    int64_t m[] = {ai, 1, 1, 0};

    HighsCDouble xi = x;
    HighsCDouble fraction = xi - double(ai);

    while (fraction > eps) {
      xi = 1.0 / fraction;
      if (double(xi) > double(int64_t{1} << 53)) break;

      ai = (int64_t)(double)xi;
      int64_t t = m[2] * ai + m[3];
      if (t > maxdenom) break;

      m[3] = m[2];
      m[2] = t;

      t = m[0] * ai + m[1];
      m[1] = m[0];
      m[0] = t;

      fraction = xi - ai;
    }

    ai = (maxdenom - m[3]) / m[2];
    m[1] += m[0] * ai;
    m[3] += m[2] * ai;

    double x0 = static_cast<double>(m[0]) / static_cast<double>(m[2]);
    double x1 = static_cast<double>(m[1]) / static_cast<double>(m[3]);
    x = std::abs(x);
    double err0 = std::abs(x - x0);
    double err1 = std::abs(x - x1);

    if (err0 < err1) return m[2];
    return m[3];
  }